

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_sse2.c
# Opt level: O0

void prepare_coeffs(InterpFilterParams *filter_params,int subpel_q4,__m256i *coeffs)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 (*in_RDX) [32];
  uint in_ESI;
  InterpFilterParams *in_RDI;
  __m256i coeff;
  __m128i coeff_8;
  int16_t *filter;
  undefined8 uStack_30;
  undefined8 uStack_28;
  
  av1_get_interp_filter_subpel_kernel(in_RDI,in_ESI & 0xf);
  auVar1._8_8_ = uStack_28;
  auVar1._0_8_ = uStack_30;
  auVar1._16_8_ = uStack_30;
  auVar1._24_8_ = uStack_28;
  auVar1 = vpshufd_avx2(auVar1,0);
  *in_RDX = auVar1;
  auVar2._8_8_ = uStack_28;
  auVar2._0_8_ = uStack_30;
  auVar2._16_8_ = uStack_30;
  auVar2._24_8_ = uStack_28;
  auVar1 = vpshufd_avx2(auVar2,0x55);
  in_RDX[1] = auVar1;
  auVar3._8_8_ = uStack_28;
  auVar3._0_8_ = uStack_30;
  auVar3._16_8_ = uStack_30;
  auVar3._24_8_ = uStack_28;
  auVar1 = vpshufd_avx2(auVar3,0xaa);
  in_RDX[2] = auVar1;
  auVar4._8_8_ = uStack_28;
  auVar4._0_8_ = uStack_30;
  auVar4._16_8_ = uStack_30;
  auVar4._24_8_ = uStack_28;
  auVar1 = vpshufd_avx2(auVar4,0xff);
  in_RDX[3] = auVar1;
  return;
}

Assistant:

static inline void prepare_coeffs(const InterpFilterParams *const filter_params,
                                  const int subpel_q4,
                                  __m128i *const coeffs /* [4] */) {
  const int16_t *const y_filter = av1_get_interp_filter_subpel_kernel(
      filter_params, subpel_q4 & SUBPEL_MASK);
  const __m128i coeffs_y = _mm_loadu_si128((__m128i *)y_filter);
  // coeffs 0 1 0 1 2 3 2 3
  const __m128i tmp_0 = _mm_unpacklo_epi32(coeffs_y, coeffs_y);
  // coeffs 4 5 4 5 6 7 6 7
  const __m128i tmp_1 = _mm_unpackhi_epi32(coeffs_y, coeffs_y);

  coeffs[0] = _mm_unpacklo_epi64(tmp_0, tmp_0);  // coeffs 0 1 0 1 0 1 0 1
  coeffs[1] = _mm_unpackhi_epi64(tmp_0, tmp_0);  // coeffs 2 3 2 3 2 3 2 3
  coeffs[2] = _mm_unpacklo_epi64(tmp_1, tmp_1);  // coeffs 4 5 4 5 4 5 4 5
  coeffs[3] = _mm_unpackhi_epi64(tmp_1, tmp_1);  // coeffs 6 7 6 7 6 7 6 7
}